

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O0

int __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::
remove(HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
       *this,char *__filename)

{
  int iVar1;
  _Pool *p_Var2;
  NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *pNVar3;
  undefined4 extraout_var;
  SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *this_00;
  pair<unsigned_long,_short> pVar4;
  HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *unaff_retaddr;
  size_t level;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *pNode;
  pair<unsigned_long,_short> ret_val;
  SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffca;
  _Pool *this_01;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *local_28;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  *in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff8;
  undefined6 in_stack_fffffffffffffffa;
  
  local_28 = (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
              *)0x0;
  _throwIfValueDoesNotCompare
            (unaff_retaddr,
             (pair<unsigned_long,_short> *)
             CONCAT62(in_stack_fffffffffffffffa,in_stack_fffffffffffffff8));
  p_Var2 = (_Pool *)SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                    ::height((SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                              *)0x1d037c7);
  do {
    this_01 = (_Pool *)((long)&p_Var2[-1].prng.state_ + 7);
    if (p_Var2 == (_Pool *)0x0) break;
    pNVar3 = SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
             ::operator[](in_stack_ffffffffffffffc0,(size_t)this);
    iVar1 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
            ::remove(pNVar3->pNode,(char *)this_01);
    local_28 = (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                *)CONCAT44(extraout_var,iVar1);
    p_Var2 = this_01;
  } while (local_28 ==
           (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
            *)0x0);
  if (local_28 ==
      (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *)
      0x0) {
    _throwValueErrorNotFound
              (unaff_retaddr,
               (pair<unsigned_long,_short> *)
               CONCAT62(in_stack_fffffffffffffffa,in_stack_fffffffffffffff8));
  }
  this_00 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
            ::nodeRefs(local_28);
  SwappableNodeRefStack<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
  ::swapLevel(this_00);
  _adjRemoveRefs(unaff_retaddr,CONCAT62(in_stack_fffffffffffffffa,in_stack_fffffffffffffff8),
                 in_stack_fffffffffffffff0);
  this->_count = this->_count - 1;
  pVar4 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
          ::_Pool::Release(this_01,(Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                                    *)CONCAT62(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8))
  ;
  return (int)pVar4.first;
}

Assistant:

T HeadNode<T, _Compare>::remove(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level;

    _throwIfValueDoesNotCompare(value);
    for (level = _nodeRefs.height(); level-- > 0;) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->remove(level, value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        _throwValueErrorNotFound(value);
    }
    // Take swap level as some swaps will have been dealt with by the remove() above.
    _adjRemoveRefs(pNode->nodeRefs().swapLevel(), pNode);
    --_count;
    T ret_val = _pool.Release(pNode);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
    return ret_val;
}